

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O2

IGUIElement * __thiscall
irr::gui::CGUIEnvironment::getNextElement(CGUIEnvironment *this,bool reverse,bool group)

{
  undefined1 *puVar1;
  IGUIElement *this_00;
  IGUIElement *pIVar2;
  s32 startOrder;
  bool bVar3;
  IGUIElement *first;
  IGUIElement *closest;
  
  if (this->Focus == (IGUIElement *)0x0) {
    bVar3 = false;
    this_00 = (IGUIElement *)0x0;
  }
  else {
    this_00 = IGUIElement::getTabGroup(this->Focus);
    bVar3 = this_00 != (IGUIElement *)0x0;
    if (bVar3 && group) {
      startOrder = this_00->TabOrder;
      bVar3 = true;
      goto LAB_0022d153;
    }
  }
  startOrder = -1;
  if ((((!group) && (pIVar2 = this->Focus, pIVar2 != (IGUIElement *)0x0)) &&
      (pIVar2->IsTabGroup == false)) && (startOrder = pIVar2->TabOrder, startOrder == -1)) {
    startOrder = -1;
    while ((startOrder == -1 && (pIVar2 = pIVar2->Parent, pIVar2 != (IGUIElement *)0x0))) {
      startOrder = pIVar2->TabOrder;
    }
  }
LAB_0022d153:
  puVar1 = &(this->super_IGUIEnvironment).field_0x8;
  pIVar2 = (IGUIElement *)0x0;
  if (group) {
    pIVar2 = (IGUIElement *)puVar1;
    this_00 = (IGUIElement *)puVar1;
  }
  if (!bVar3) {
    this_00 = (IGUIElement *)puVar1;
  }
  closest = (IGUIElement *)0x0;
  first = (IGUIElement *)0x0;
  IGUIElement::getNextElement
            (this_00,startOrder,reverse,group,&first,&closest,false,(this->FocusFlags & 0x16) != 0);
  if (first != (IGUIElement *)0x0) {
    pIVar2 = first;
  }
  if (closest != (IGUIElement *)0x0) {
    pIVar2 = closest;
  }
  return pIVar2;
}

Assistant:

IGUIElement *CGUIEnvironment::getNextElement(bool reverse, bool group)
{
	// start the search at the root of the current tab group
	IGUIElement *startPos = Focus ? Focus->getTabGroup() : 0;
	s32 startOrder = -1;

	// if we're searching for a group
	if (group && startPos) {
		startOrder = startPos->getTabOrder();
	} else if (!group && Focus && !Focus->isTabGroup()) {
		startOrder = Focus->getTabOrder();
		if (startOrder == -1) {
			// this element is not part of the tab cycle,
			// but its parent might be...
			IGUIElement *el = Focus;
			while (el && el->getParent() && startOrder == -1) {
				el = el->getParent();
				startOrder = el->getTabOrder();
			}
		}
	}

	if (group || !startPos)
		startPos = this; // start at the root

	// find the element
	IGUIElement *closest = 0;
	IGUIElement *first = 0;
	startPos->getNextElement(startOrder, reverse, group, first, closest, false, (FocusFlags & EFF_CAN_FOCUS_DISABLED) != 0);

	if (closest)
		return closest; // we found an element
	else if (first)
		return first; // go to the end or the start
	else if (group)
		return this; // no group found? root group
	else
		return 0;
}